

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_divq_EAX_x86_64(CPUX86State *env,target_ulong t0)

{
  int iVar1;
  uintptr_t unaff_retaddr;
  target_ulong local_28;
  uint64_t r1;
  uint64_t r0;
  target_ulong t0_local;
  CPUX86State *env_local;
  
  r0 = t0;
  t0_local = (target_ulong)env;
  if (t0 == 0) {
    raise_exception_ra_x86_64(env,0,unaff_retaddr);
  }
  r1 = env->regs[0];
  local_28 = env->regs[2];
  iVar1 = div64(&r1,&local_28,t0);
  if (iVar1 != 0) {
    raise_exception_ra_x86_64((CPUX86State *)t0_local,0,unaff_retaddr);
  }
  *(uint64_t *)t0_local = r1;
  *(target_ulong *)(t0_local + 0x10) = local_28;
  return;
}

Assistant:

void helper_divq_EAX(CPUX86State *env, target_ulong t0)
{
    uint64_t r0, r1;

    if (t0 == 0) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    r0 = env->regs[R_EAX];
    r1 = env->regs[R_EDX];
    if (div64(&r0, &r1, t0)) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    env->regs[R_EAX] = r0;
    env->regs[R_EDX] = r1;
}